

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_root.c
# Opt level: O0

int main(void)

{
  int iVar1;
  SUNContext ctx;
  sunrealtype reltol;
  sunrealtype w0;
  sunrealtype v0;
  sunrealtype u0;
  long nge;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  int iout;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  void *arkode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector atols;
  N_Vector y;
  int flag;
  int rtflag;
  int rootsfound [2];
  sunindextype NEQ;
  int Nt;
  sunrealtype TMult;
  sunrealtype T1;
  sunrealtype T0;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  void *flagvalue;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  int local_84;
  double local_80;
  undefined8 local_78;
  FILE *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long *local_50;
  long *local_48;
  int local_40;
  undefined4 local_3c;
  uint local_38;
  uint local_34;
  undefined8 local_30;
  int local_24;
  double local_20;
  double local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0;
  local_18 = 0.4;
  local_20 = 10.0;
  local_24 = 0xc;
  local_30 = 3;
  local_48 = (long *)0x0;
  local_50 = (long *)0x0;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  flagvalue = (void *)0x3f1a36e2eb1c432d;
  local_40 = SUNContext_Create(0,&stack0xfffffffffffffef0);
  iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  if (iVar1 == 0) {
    printf("\nRobertson ODE test problem (with rootfinding):\n");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff0000000000000,0,0);
    local_48 = (long *)N_VNew_Serial(local_30,in_stack_fffffffffffffef0);
    iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    if (iVar1 == 0) {
      **(undefined8 **)(*local_48 + 0x10) = 0x3ff0000000000000;
      *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8) = 0;
      *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10) = 0;
      local_50 = (long *)N_VClone(local_48);
      iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      if (iVar1 == 0) {
        **(undefined8 **)(*local_50 + 0x10) = 0x3e45798ee2308c3a;
        *(undefined8 *)(*(long *)(*local_50 + 0x10) + 8) = 0x3da5fd7fe1796495;
        *(undefined8 *)(*(long *)(*local_50 + 0x10) + 0x10) = 0x3e45798ee2308c3a;
        local_68 = ARKStepCreate(local_10,0,f,local_48,in_stack_fffffffffffffef0);
        iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        if (iVar1 == 0) {
          local_40 = ARKodeSetMaxErrTestFails(local_68,0x14);
          iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          if (iVar1 == 0) {
            local_40 = ARKodeSetMaxNonlinIters(local_68,8);
            iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
            if (iVar1 == 0) {
              local_40 = ARKodeSetNonlinConvCoef(0x3e7ad7f29abcaf48,local_68);
              iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
              if (iVar1 == 0) {
                local_40 = ARKodeSetMaxNumSteps(local_68,100000);
                iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
                if (iVar1 == 0) {
                  local_40 = ARKodeSetPredictorMethod(local_68,1);
                  iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
                  if (iVar1 == 0) {
                    local_40 = ARKodeSVtolerances(flagvalue,local_68,local_50);
                    iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec
                                      );
                    if (iVar1 == 0) {
                      local_40 = ARKodeRootInit(local_68,2,g);
                      iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                         in_stack_fffffffffffffeec);
                      if (iVar1 == 0) {
                        local_58 = SUNDenseMatrix(local_30,local_30,in_stack_fffffffffffffef0);
                        iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                        if (iVar1 == 0) {
                          local_60 = SUNLinSol_Dense(local_48,local_58,in_stack_fffffffffffffef0);
                          iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                             in_stack_fffffffffffffeec);
                          if (iVar1 == 0) {
                            local_40 = ARKodeSetLinearSolver(local_68,local_60,local_58);
                            iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                               in_stack_fffffffffffffeec);
                            if (iVar1 == 0) {
                              local_40 = ARKodeSetJacFn(local_68,Jac);
                              iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                                 in_stack_fffffffffffffeec);
                              if (iVar1 == 0) {
                                local_70 = fopen("solution.txt","w");
                                fprintf(local_70,"# t u v w\n");
                                fprintf(local_70," %.16e %.16e %.16e %.16e\n",local_10,
                                        **(undefined8 **)(*local_48 + 0x10),
                                        *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                        *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                local_78 = local_10;
                                printf("        t             u             v             w\n");
                                printf("   -----------------------------------------------------\n")
                                ;
                                printf("  %12.5e  %12.5e  %12.5e  %12.5e\n",local_78,
                                       **(undefined8 **)(*local_48 + 0x10),
                                       *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                       *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                local_80 = local_18;
                                local_84 = 0;
                                do {
                                  local_40 = ARKodeEvolve(local_80,local_68,local_48,&local_78,1);
                                  iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                                     in_stack_fffffffffffffeec);
                                  if (iVar1 != 0) break;
                                  printf("  %12.5e  %12.5e  %12.5e  %12.5e\n",local_78,
                                         **(undefined8 **)(*local_48 + 0x10),
                                         *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                         *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                  fprintf(local_70," %.16e %.16e %.16e %.16e\n",local_78,
                                          **(undefined8 **)(*local_48 + 0x10),
                                          *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                          *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                  if (local_40 == 2) {
                                    local_3c = ARKodeGetRootInfo(local_68,&local_38);
                                    iVar1 = check_flag(flagvalue,in_stack_fffffffffffffef0,
                                                       in_stack_fffffffffffffeec);
                                    if (iVar1 != 0) {
                                      return 1;
                                    }
                                    printf("      rootsfound[] = %3d %3d\n",(ulong)local_38,
                                           (ulong)local_34);
                                  }
                                  if (local_40 < 0) {
                                    fprintf(_stderr,"Solver failure, stopping integration\n");
                                    break;
                                  }
                                  local_84 = local_84 + 1;
                                  local_80 = local_20 * local_80;
                                } while (local_84 != local_24);
                                printf("   -----------------------------------------------------\n")
                                ;
                                fclose(local_70);
                                local_40 = ARKodeGetNumSteps(local_68,&local_90);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumStepAttempts(local_68,&local_98);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumRhsEvals(local_68,0,&local_a0);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumRhsEvals(local_68,1,&local_a8);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumLinSolvSetups(local_68,&local_b0);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumErrTestFails(local_68,&local_e0);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumStepSolveFails(local_68,&local_d8);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumNonlinSolvIters(local_68,&local_c8);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumNonlinSolvConvFails(local_68,&local_d0);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumJacEvals(local_68,&local_b8);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumLinRhsEvals(local_68,&local_c0);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                local_40 = ARKodeGetNumGEvals(local_68,&local_e8);
                                check_flag(flagvalue,in_stack_fffffffffffffef0,
                                           in_stack_fffffffffffffeec);
                                printf("\nFinal Solver Statistics:\n");
                                printf("   Internal solver steps = %li (attempted = %li)\n",local_90
                                       ,local_98);
                                printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_a0,
                                       local_a8);
                                printf("   Total linear solver setups = %li\n",local_b0);
                                printf("   Total RHS evals for setting up the linear system = %li\n"
                                       ,local_c0);
                                printf("   Total number of Jacobian evaluations = %li\n",local_b8);
                                printf("   Total number of Newton iterations = %li\n",local_c8);
                                printf("   Total root-function g evals = %li\n",local_e8);
                                printf("   Total number of nonlinear solver convergence failures = %li\n"
                                       ,local_d0);
                                printf("   Total number of error test failures = %li\n",local_e0);
                                printf("   Total number of failed steps from solver failure = %li\n"
                                       ,local_d8);
                                N_VDestroy(local_48);
                                N_VDestroy(local_50);
                                ARKodeFree(&local_68);
                                SUNLinSolFree(local_60);
                                SUNMatDestroy(local_58);
                                SUNContext_Free(&stack0xfffffffffffffef0);
                                local_4 = 0;
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);  /* initial time */
  sunrealtype T1    = SUN_RCONST(0.4);  /* first output time */
  sunrealtype TMult = SUN_RCONST(10.0); /* output time multiplication factor */
  int Nt            = 12;               /* total number of output times */
  sunindextype NEQ  = 3;                /* number of dependent vars. */

  /* rootfinding variables */
  int rootsfound[2];
  int rtflag; /* root info flag */

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector atols     = NULL; /* empty vector for absolute tolerances */
  SUNMatrix A        = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nge;

  /* set up the initial conditions */
  sunrealtype u0     = SUN_RCONST(1.0);
  sunrealtype v0     = SUN_RCONST(0.0);
  sunrealtype w0     = SUN_RCONST(0.0);
  sunrealtype reltol = SUN_RCONST(1.0e-4);

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nRobertson ODE test problem (with rootfinding):\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions into y */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  atols = N_VClone(y); /* Create serial vector absolute tolerances */
  if (check_flag((void*)atols, "N_VNew_Serial", 0)) { return 1; }

  /* Set absolute tolerances */
  NV_Ith_S(atols, 0) = SUN_RCONST(1.0e-8);
  NV_Ith_S(atols, 1) = SUN_RCONST(1.0e-11);
  NV_Ith_S(atols, 2) = SUN_RCONST(1.0e-8);

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the initial time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetMaxErrTestFails(arkode_mem,
                                  20); /* Increase max error test fails */
  if (check_flag(&flag, "ARKodeSetMaxErrTestFails", 1)) { return 1; }
  flag = ARKodeSetMaxNonlinIters(arkode_mem, 8); /* Increase max nonlin iters  */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }
  flag = ARKodeSetNonlinConvCoef(arkode_mem,
                                 SUN_RCONST(1.e-7)); /* Set nonlinear convergence coeff. */
  if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 100000); /* Increase max num steps */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem,
                                  1); /* Specify maximum-order predictor */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }
  flag = ARKodeSVtolerances(arkode_mem, reltol, atols); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Specify the root-finding function, having 2 equations */
  flag = ARKodeRootInit(arkode_mem, 2, g);
  if (check_flag(&flag, "ARKodeRootInit", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t = T0;
  printf("        t             u             v             w\n");
  printf("   -----------------------------------------------------\n");
  printf("  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
  tout = T1;
  iout = 0;
  while (1)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag == ARK_ROOT_RETURN)
    { /* check if a root was found */
      rtflag = ARKodeGetRootInfo(arkode_mem, rootsfound);
      if (check_flag(&rtflag, "ARKodeGetRootInfo", 1)) { return 1; }
      printf("      rootsfound[] = %3d %3d\n", rootsfound[0], rootsfound[1]);
    }
    if (flag >= 0)
    { /* successful solve: update output time */
      iout++;
      tout *= TMult;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
    if (iout == Nt) { break; /* stop after enough outputs */ }
  }
  printf("   -----------------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfe);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 1, &nfi);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);
  flag = ARKodeGetNumGEvals(arkode_mem, &nge);
  check_flag(&flag, "ARKodeGetNumGEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total root-function g evals = %li\n", nge);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  N_VDestroy(atols);       /* Free atols vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}